

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent
          (QGraphicsProxyWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  QPointer<QWidget> *this_00;
  QPointer<QWidget> *this_01;
  Data *pDVar1;
  QGraphicsItem *pQVar2;
  undefined4 uVar3;
  bool bVar4;
  char cVar5;
  MouseButton MVar6;
  MouseButtons MVar7;
  KeyboardModifiers KVar8;
  MouseEventSource MVar9;
  QFlagsStorage<Qt::MouseButton> QVar10;
  QWidget *pQVar11;
  QWeakPointer<QObject> *pQVar12;
  QGraphicsItem *pQVar13;
  QPoint QVar14;
  QWidget *pQVar15;
  undefined8 uVar16;
  QWidget *nativeWidget;
  QWeakPointer<QObject> *other;
  QGraphicsItem *pQVar17;
  QWeakPointer<QObject> *other_00;
  long in_FS_OFFSET;
  QPointF QVar18;
  undefined4 local_134;
  byte local_130;
  QCursor widgetsCursor;
  QPoint local_e8;
  QWidget *embeddedMouseGrabberPtr;
  double local_d8;
  QPoint local_d0;
  QGraphicsItem local_c8;
  QMouseEvent mouseEvent;
  QWeakPointer<QObject> local_68;
  QWeakPointer<QObject> local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event == (QGraphicsSceneMouseEvent *)0x0) goto LAB_0058d819;
  other_00 = &(this->widget).wp;
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)other_00);
  if ((!bVar4) || ((*(byte *)(*(long *)((this->widget).wp.value + 0x20) + 9) & 0x80) == 0))
  goto LAB_0058d819;
  pQVar13 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pQVar17 = pQVar13 + -1;
  if (pQVar13 == (QGraphicsItem *)0x0) {
    pQVar17 = (QGraphicsItem *)0x0;
  }
  QVar18 = QGraphicsSceneMouseEvent::pos(event);
  local_48.yp = QVar18.yp;
  local_48.xp = QVar18.xp;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar1 = (this->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar11 = (QWidget *)0x0;
  }
  else {
    pQVar11 = (QWidget *)(this->widget).wp.value;
  }
  _mouseEvent = QPointF::toPoint(&local_48);
  pQVar11 = QWidget::childAt(pQVar11,(QPoint *)&mouseEvent);
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_58,pQVar11);
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
  pQVar12 = other_00;
  if (bVar4) {
    pQVar12 = &local_58;
  }
  local_68.d = pQVar12->d;
  pQVar12 = &local_58;
  if (!bVar4) {
    pQVar12 = &(this->widget).wp;
  }
  local_68.value = pQVar12->value;
  if (local_68.d == (Data *)0x0) {
LAB_0058d1f9:
    pQVar11 = (QWidget *)0x0;
  }
  else {
    LOCK();
    *(int *)local_68.d = *(int *)local_68.d + 1;
    UNLOCK();
    if ((local_68.d == (Data *)0x0) ||
       (pQVar11 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) goto LAB_0058d1f9;
  }
  pQVar13 = (QGraphicsItem *)QWidgetPrivate::nearestGraphicsProxyWidget(pQVar11);
  if (pQVar13 != pQVar17) goto LAB_0058d7ff;
  switch(*(undefined2 *)&(event->super_QGraphicsSceneEvent).field_0x8) {
  case 0x9b:
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this->embeddedMouseGrabber);
    local_134 = 5;
    uVar3 = 5;
    if (bVar4) goto LAB_0058d2a7;
    goto LAB_0058d2c4;
  case 0x9c:
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this->embeddedMouseGrabber);
    local_134 = 2;
    goto LAB_0058d29e;
  case 0x9d:
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this->embeddedMouseGrabber);
    local_134 = 3;
    local_130 = 1;
    if (bVar4) {
      QWeakPointer<QObject>::operator=(&local_68,&(this->embeddedMouseGrabber).wp);
    }
    break;
  case 0x9e:
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this->embeddedMouseGrabber);
    local_134 = 4;
LAB_0058d29e:
    pQVar12 = &(this->embeddedMouseGrabber).wp;
    if (bVar4 == false) {
      other = &local_68;
    }
    else {
LAB_0058d2a7:
      other = &(this->embeddedMouseGrabber).wp;
      pQVar12 = &local_68;
    }
    QWeakPointer<QObject>::operator=(pQVar12,other);
    uVar3 = local_134;
LAB_0058d2c4:
    local_134 = uVar3;
    local_130 = 0;
    break;
  default:
    local_130 = 0;
    local_134 = 0;
  }
  this_00 = &this->lastWidgetUnderMouse;
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (!bVar4) {
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this->embeddedMouseGrabber);
    pQVar12 = &local_68;
    if (bVar4) {
      pQVar12 = &(this->embeddedMouseGrabber).wp;
    }
    if ((pQVar12->d == (Data *)0x0) || (*(int *)(pQVar12->d + 4) == 0)) {
      pQVar11 = (QWidget *)0x0;
    }
    else {
      pQVar12 = &local_68;
      if (bVar4) {
        pQVar12 = &(this->embeddedMouseGrabber).wp;
      }
      pQVar11 = (QWidget *)pQVar12->value;
    }
    QVar14 = QGraphicsSceneMouseEvent::screenPos(event);
    _mouseEvent = (QPoint)(double)QVar14.xp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave(pQVar11,(QWidget *)0x0,(QPointF *)&mouseEvent);
    QWeakPointer<QObject>::operator=(&this_00->wp,&local_68);
  }
  if ((local_68.d == (Data *)0x0) ||
     (pQVar11 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar11 = (QWidget *)0x0;
  }
  QVar18 = mapToReceiver(this,&local_48,pQVar11);
  local_48.yp = QVar18.yp;
  local_48.xp = QVar18.xp;
  _mouseEvent = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar11 = (QWidget *)local_68.value;
  if (*(int *)(local_68.d + 4) == 0) {
    pQVar11 = (QWidget *)0x0;
  }
  pQVar15 = QWidget::window((QWidget *)local_68.value);
  local_d0 = QPointF::toPoint(&local_48);
  QVar14 = QWidget::mapTo(pQVar11,pQVar15,&local_d0);
  local_c8._vptr_QGraphicsItem = (_func_int **)(double)QVar14.xp.m_i.m_i;
  local_c8.d_ptr.d = (QGraphicsItemPrivate *)(double)QVar14.yp.m_i.m_i;
  pQVar11 = (QWidget *)0x0;
  if ((local_68.d != (Data *)0x0) &&
     (pQVar11 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar11 = (QWidget *)0x0;
  }
  local_e8 = QPointF::toPoint(&local_48);
  QVar14 = QWidget::mapToGlobal(pQVar11,&local_e8);
  embeddedMouseGrabberPtr = (QWidget *)(double)QVar14.xp.m_i.m_i;
  local_d8 = (double)QVar14.yp.m_i.m_i;
  MVar6 = QGraphicsSceneMouseEvent::button(event);
  MVar7 = QGraphicsSceneMouseEvent::buttons(event);
  KVar8 = QGraphicsSceneMouseEvent::modifiers(event);
  MVar9 = QGraphicsSceneMouseEvent::source(event);
  widgetsCursor.d = (QCursorData *)0x0;
  uVar16 = QPointingDevice::primaryPointingDevice((QString *)&widgetsCursor);
  QMouseEvent::QMouseEvent
            (&mouseEvent,local_134,&local_48,&local_c8,&embeddedMouseGrabberPtr,MVar6,
             MVar7.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
             super_QFlagsStorage<Qt::MouseButton>.i,
             KVar8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i,MVar9,uVar16);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&widgetsCursor);
  QGraphicsSceneEvent::timestamp(&event->super_QGraphicsSceneEvent);
  QPointerEvent::setTimestamp((ulonglong)&mouseEvent);
  pDVar1 = (this->embeddedMouseGrabber).wp.d;
  if (pDVar1 == (Data *)0x0) {
    embeddedMouseGrabberPtr = (QWidget *)0x0;
  }
  else if (*(int *)(pDVar1 + 4) == 0) {
    embeddedMouseGrabberPtr = (QWidget *)0x0;
  }
  else {
    embeddedMouseGrabberPtr = (QWidget *)(this->embeddedMouseGrabber).wp.value;
  }
  if ((local_68.d == (Data *)0x0) ||
     (pQVar11 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar11 = (QWidget *)0x0;
  }
  if ((local_58.d == (Data *)0x0) ||
     (pQVar15 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
    pQVar15 = (QWidget *)0x0;
  }
  this_01 = &this->embeddedMouseGrabber;
  pDVar1 = (((QPointer<QWidget> *)other_00)->wp).d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    nativeWidget = (QWidget *)0x0;
  }
  else {
    nativeWidget = (QWidget *)(this->widget).wp.value;
  }
  QApplicationPrivate::sendMouseEvent
            (pQVar11,&mouseEvent,pQVar15,nativeWidget,&embeddedMouseGrabberPtr,this_00,
             (bool)(event->super_QGraphicsSceneEvent).field_0xb,false);
  QWeakPointer<QObject>::assign<QObject>(&this_01->wp,&embeddedMouseGrabberPtr->super_QObject);
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_01);
  if (((local_130 & bVar4) == 1) &&
     (QVar10.i = (Int)QGraphicsSceneMouseEvent::buttons(event),
     (QFlagsStorage<Qt::MouseButton>)QVar10.i == (QFlagsStorage<Qt::MouseButton>)0x0)) {
    pQVar2 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
    pQVar13 = pQVar2 + -1;
    if (pQVar2 == (QGraphicsItem *)0x0) {
      pQVar13 = (QGraphicsItem *)0x0;
    }
    QGraphicsWidget::size((QGraphicsWidget *)pQVar13);
    widgetsCursor.d = (QCursorData *)0x0;
    QVar18 = QGraphicsSceneMouseEvent::pos(event);
    local_c8.d_ptr.d = (QGraphicsItemPrivate *)QVar18.yp;
    local_c8._vptr_QGraphicsItem = (_func_int **)QVar18.xp;
    cVar5 = QRectF::contains((QPointF *)&widgetsCursor);
    if ((cVar5 == '\0') || (bVar4 = QGraphicsItem::acceptHoverEvents(pQVar13 + 1), !bVar4)) {
      QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)0x0);
    }
    else {
      bVar4 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
      if (bVar4) {
        other_00 = &local_58;
      }
      QWeakPointer<QObject>::operator=(&this_00->wp,other_00);
    }
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar11 = (QWidget *)0x0;
    }
    else {
      pQVar11 = (QWidget *)(this->lastWidgetUnderMouse).wp.value;
    }
    pDVar1 = (this_01->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar15 = (QWidget *)0x0;
    }
    else {
      pQVar15 = (QWidget *)(this->embeddedMouseGrabber).wp.value;
    }
    QVar14 = QGraphicsSceneMouseEvent::screenPos(event);
    widgetsCursor.d = (QCursorData *)(double)QVar14.xp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave(pQVar11,pQVar15,(QPointF *)&widgetsCursor);
    QWeakPointer<QObject>::assign<QObject>(&this_01->wp,(QObject *)0x0);
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (!bVar4) {
      QGraphicsItem::unsetCursor(pQVar13 + 1);
    }
  }
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar4) {
    widgetsCursor.d = (QCursorData *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::cursor((QWidget *)&widgetsCursor);
    QGraphicsItem::cursor(&local_c8);
    bVar4 = ::operator!=((QCursor *)&local_c8,&widgetsCursor);
    QCursor::~QCursor((QCursor *)&local_c8);
    if (bVar4) {
      QGraphicsItem::setCursor(pQVar17 + 1,&widgetsCursor);
    }
    QCursor::~QCursor(&widgetsCursor);
  }
  (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,0xaa);
  QMouseEvent::~QMouseEvent(&mouseEvent);
LAB_0058d7ff:
  QWeakPointer<QObject>::~QWeakPointer(&local_68);
  QWeakPointer<QObject>::~QWeakPointer(&local_58);
LAB_0058d819:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent(QGraphicsSceneMouseEvent *event)
{
    if (!event || !widget || !widget->isVisible())
        return;
    Q_Q(QGraphicsProxyWidget);

    // Find widget position and receiver.
    QPointF pos = event->pos();
    QPointer<QWidget> alienWidget = widget->childAt(pos.toPoint());
    QPointer<QWidget> receiver =  alienWidget ? alienWidget : widget;

    if (QWidgetPrivate::nearestGraphicsProxyWidget(receiver) != q)
        return; //another proxywidget will handle the events

    // Translate QGraphicsSceneMouse events to QMouseEvents.
    QEvent::Type type = QEvent::None;
    switch (event->type()) {
    case QEvent::GraphicsSceneMousePress:
        type = QEvent::MouseButtonPress;
        if (!embeddedMouseGrabber)
            embeddedMouseGrabber = receiver;
        else
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseRelease:
        type = QEvent::MouseButtonRelease;
        if (embeddedMouseGrabber)
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseDoubleClick:
        type = QEvent::MouseButtonDblClick;
        if (!embeddedMouseGrabber)
            embeddedMouseGrabber = receiver;
        else
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseMove:
        type = QEvent::MouseMove;
        if (embeddedMouseGrabber)
            receiver = embeddedMouseGrabber;
        break;
    default:
        Q_ASSERT_X(false, "QGraphicsProxyWidget", "internal error");
        break;
    }

    if (!lastWidgetUnderMouse) {
        QApplicationPrivate::dispatchEnterLeave(embeddedMouseGrabber ? embeddedMouseGrabber : receiver, nullptr, event->screenPos());
        lastWidgetUnderMouse = receiver;
    }

    // Map event position from us to the receiver
    pos = mapToReceiver(pos, receiver);

    // Send mouse event.
    QMouseEvent mouseEvent(type, pos, receiver->mapTo(receiver->topLevelWidget(), pos.toPoint()),
                           receiver->mapToGlobal(pos.toPoint()),
                           event->button(), event->buttons(), event->modifiers(), event->source());
    mouseEvent.setTimestamp(event->timestamp());

    QWidget *embeddedMouseGrabberPtr = (QWidget *)embeddedMouseGrabber;
    QApplicationPrivate::sendMouseEvent(receiver, &mouseEvent, alienWidget, widget,
                                        &embeddedMouseGrabberPtr, lastWidgetUnderMouse, event->spontaneous());
    embeddedMouseGrabber = embeddedMouseGrabberPtr;

    // Handle enter/leave events when last button is released from mouse
    // grabber child widget.
    if (embeddedMouseGrabber && type == QEvent::MouseButtonRelease && !event->buttons()) {
        Q_Q(QGraphicsProxyWidget);
        if (q->rect().contains(event->pos()) && q->acceptHoverEvents())
            lastWidgetUnderMouse = alienWidget ? alienWidget : widget;
        else // released on the frame our outside the item, or doesn't accept hover events.
            lastWidgetUnderMouse = nullptr;

        QApplicationPrivate::dispatchEnterLeave(lastWidgetUnderMouse, embeddedMouseGrabber, event->screenPos());
        embeddedMouseGrabber = nullptr;

#ifndef QT_NO_CURSOR
        // ### Restore the cursor, don't override it.
        if (!lastWidgetUnderMouse)
            q->unsetCursor();
#endif
    }

#ifndef QT_NO_CURSOR
    // Keep cursor in sync
    if (lastWidgetUnderMouse) {
        QCursor widgetsCursor = lastWidgetUnderMouse->cursor();
        if (q->cursor() != widgetsCursor)
            q->setCursor(widgetsCursor);
    }
#endif

    event->setAccepted(mouseEvent.isAccepted());
}